

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::DecimalFormatSymbols::getPatternForCurrencySpacing
          (DecimalFormatSymbols *this,UCurrencySpacing type,UBool beforeCurrency,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  UBool beforeCurrency_local;
  UCurrencySpacing type_local;
  DecimalFormatSymbols *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (beforeCurrency == '\0') {
      this_local = (DecimalFormatSymbols *)(&this->field_0xa38 + (long)(int)type * 0x40);
    }
    else {
      this_local = (DecimalFormatSymbols *)(&this->field_0x978 + (long)(int)type * 0x40);
    }
  }
  else {
    this_local = (DecimalFormatSymbols *)&this->fNoSymbol;
  }
  return (UnicodeString *)this_local;
}

Assistant:

const UnicodeString&
DecimalFormatSymbols::getPatternForCurrencySpacing(UCurrencySpacing type,
                                                 UBool beforeCurrency,
                                                 UErrorCode& status) const {
    if (U_FAILURE(status)) {
      return fNoSymbol;  // always empty.
    }
    if (beforeCurrency) {
      return currencySpcBeforeSym[(int32_t)type];
    } else {
      return currencySpcAfterSym[(int32_t)type];
    }
}